

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupOrdered(Aig_Man_t *p)

{
  int iVar1;
  Aig_Type_t Type;
  int iVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  Tim_Man_t *pTVar7;
  int local_2c;
  int nNodes;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar5 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar5;
  }
  Aig_ManCleanData(p);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsBuf(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsCi(pObj_00);
          if (iVar1 == 0) {
            iVar1 = Aig_ObjIsCo(pObj_00);
            if (iVar1 == 0) {
              iVar1 = Aig_ObjIsConst1(pObj_00);
              if (iVar1 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                              ,0x13e,"Aig_Man_t *Aig_ManDupOrdered(Aig_Man_t *)");
              }
              _nNodes = Aig_ManConst1(p_00);
            }
            else {
              pAVar6 = Aig_ObjChild0Copy(pObj_00);
              _nNodes = Aig_ObjCreateCo(p_00,pAVar6);
            }
          }
          else {
            _nNodes = Aig_ObjCreateCi(p_00);
            *(ulong *)&_nNodes->field_0x18 =
                 *(ulong *)&_nNodes->field_0x18 & 0xff000000ffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)&pObj_00->field_0x18 >> 0x20) & 0xffffff) <<
                 0x20;
          }
        }
        else {
          pAVar6 = Aig_ObjChild0Copy(pObj_00);
          p1 = Aig_ObjChild1Copy(pObj_00);
          Type = Aig_ObjType(pObj_00);
          _nNodes = Aig_Oper(p_00,pAVar6,p1,Type);
        }
      }
      else {
        _nNodes = Aig_ObjChild0Copy(pObj_00);
      }
      (pObj_00->field_5).pData = _nNodes;
    }
  }
  iVar1 = Aig_ManBufNum(p);
  if (iVar1 == 0) {
    iVar1 = Aig_ManNodeNum(p);
    iVar2 = Aig_ManNodeNum(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                    ,0x141,"Aig_Man_t *Aig_ManDupOrdered(Aig_Man_t *)");
    }
  }
  uVar3 = Aig_ManCleanup(p_00);
  if (uVar3 != 0) {
    printf("Aig_ManDupOrdered(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar3);
  }
  iVar1 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar1);
  if (p->pManTime != (void *)0x0) {
    pTVar7 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar7;
  }
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 == 0) {
    printf("Aig_ManDupOrdered(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupOrdered( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsBuf(pObj) )
        {
            pObjNew = Aig_ObjChild0Copy(pObj);
        }
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        }
        else if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        }
        else if ( Aig_ObjIsConst1(pObj) )
        {
            pObjNew = Aig_ManConst1(pNew);
        }
        else
            assert( 0 );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupOrdered(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupOrdered(): The check has failed.\n" );
    return pNew;
}